

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conv2d-dw.cpp
# Opt level: O1

bool check_equal(vector<float,_std::allocator<float>_> *result,
                vector<float,_std::allocator<float>_> *expected)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  
  pfVar1 = (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pfVar2 = (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar5 = (long)pfVar2 - (long)pfVar1 >> 2;
  pfVar3 = (expected->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar5 == (long)(expected->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pfVar3 >> 2) {
    bVar6 = pfVar2 == pfVar1;
    if (!bVar6) {
      fVar7 = *pfVar1;
      fVar8 = *pfVar3;
      uVar4 = 0;
      if (ABS(fVar7 - fVar8) <= 1e-05) {
        uVar4 = 0;
        do {
          if ((uVar5 + (uVar5 == 0)) - 1 == uVar4) {
            return uVar5 <= uVar4 + 1;
          }
          fVar7 = pfVar1[uVar4 + 1];
          fVar8 = pfVar3[uVar4 + 1];
          uVar4 = uVar4 + 1;
        } while (ABS(fVar7 - fVar8) <= 1e-05);
        bVar6 = uVar5 <= uVar4;
      }
      printf("result[%d] %f != %f expected[%d]\n",(double)fVar7,(double)fVar8,uVar4 & 0xffffffff);
    }
  }
  else {
    bVar6 = false;
    printf("result.size() = %d, expected.size() = %d\n");
  }
  return bVar6;
}

Assistant:

bool check_equal(const std::vector<float> & result, const std::vector<float> & expected) {
    if (result.size() != expected.size()) {
        printf("result.size() = %d, expected.size() = %d\n", (int)result.size(), (int)expected.size());
        return false;
    }
    for (int i = 0; i < result.size(); i++) {
        if(std::abs(result[i] - expected[i]) > 1e-5) {
            printf("result[%d] %f != %f expected[%d]\n", i, result[i], expected[i], i);
            return false;
        }
    }
    return true;
}